

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simdjson.h
# Opt level: O2

bool parse_float(uint8_t *buf,ParsedJson *pj,uint32_t offset,bool found_minus)

{
  byte *pbVar1;
  uint64_t *puVar2;
  byte *pbVar3;
  undefined7 in_register_00000009;
  byte bVar4;
  ulong uVar5;
  byte *pbVar6;
  byte bVar7;
  uint uVar8;
  ulong uVar9;
  byte bVar10;
  byte bVar11;
  uint uVar12;
  byte bVar13;
  bool bVar14;
  double dVar15;
  double dVar16;
  
  uVar9 = (ulong)offset;
  uVar5 = CONCAT71(in_register_00000009,found_minus) & 0xffffffff;
  if (buf[uVar5 + uVar9] == '0') {
    bVar4 = buf[uVar5 + uVar9 + 1];
    pbVar3 = buf + uVar5 + uVar9 + 1;
    dVar15 = 0.0;
  }
  else {
    dVar15 = (double)(byte)(buf[uVar5 + uVar9] - 0x30);
    pbVar3 = buf + uVar5 + uVar9;
    while( true ) {
      pbVar3 = pbVar3 + 1;
      bVar4 = *pbVar3;
      if (9 < (byte)(bVar4 - 0x30)) break;
      dVar15 = dVar15 * 10.0 + (double)(int)(char)(bVar4 - 0x30);
    }
  }
  if (bVar4 == 0x2e) {
    pbVar1 = pbVar3 + 1;
    if (9 < (byte)(*pbVar1 - 0x30)) {
      return false;
    }
    pbVar3 = pbVar3 + 2;
    dVar15 = (double)(int)(char)(*pbVar1 - 0x30) * 0.1 + dVar15;
    dVar16 = 0.1;
    while( true ) {
      bVar4 = *pbVar3;
      if (9 < (byte)(bVar4 - 0x30)) break;
      pbVar3 = pbVar3 + 1;
      dVar16 = dVar16 * 0.1;
      dVar15 = (double)(int)(char)(bVar4 - 0x30) * dVar16 + dVar15;
    }
  }
  if ((bVar4 | 0x20) == 0x65) {
    pbVar1 = pbVar3 + 1;
    bVar14 = (*pbVar1 - 0x2b & 0xfd) == 0;
    pbVar6 = pbVar3 + 1;
    if (bVar14) {
      pbVar6 = pbVar3 + 2;
    }
    bVar7 = pbVar3[(ulong)bVar14 + 1] - 0x30;
    if (9 < bVar7) {
      return false;
    }
    bVar10 = pbVar6[1] - 0x30;
    pbVar3 = pbVar6 + 2;
    if (9 < bVar10) {
      pbVar3 = pbVar6 + 1;
    }
    bVar11 = pbVar6[(ulong)(bVar10 < 10) + 1] - 0x30;
    bVar13 = pbVar3[bVar11 < 10] - 0x30;
    pbVar3 = pbVar3 + (ulong)(bVar13 < 10) + (ulong)(bVar11 < 10);
    bVar4 = *pbVar3;
    if ((byte)(bVar4 - 0x30) < 10) {
      return false;
    }
    uVar12 = (uint)bVar10 + (uint)bVar7 * 10;
    if (9 < bVar10) {
      uVar12 = (uint)bVar7;
    }
    uVar8 = (uint)bVar11 + uVar12 * 10;
    if (9 < bVar11) {
      uVar8 = uVar12;
    }
    uVar12 = (uint)bVar13 + uVar8 * 10;
    if (9 < bVar13) {
      uVar12 = uVar8;
    }
    uVar8 = -uVar12;
    if (*pbVar1 != 0x2d) {
      uVar8 = uVar12;
    }
    if (0x268 < uVar8 + 0x134) {
      return false;
    }
    dVar15 = dVar15 * power_of_ten[uVar8 + 0x134];
  }
  if (structural_or_whitespace_negated[bVar4] != 0) {
    return false;
  }
  if (found_minus) {
    dVar15 = -dVar15;
  }
  puVar2 = pj->tape;
  uVar12 = pj->current_loc;
  puVar2[uVar12] = 0x6400000000000000;
  pj->current_loc = uVar12 + 2;
  puVar2[uVar12 + 1] = (uint64_t)dVar15;
  return structural_or_whitespace[*pbVar3] != 0;
}

Assistant:

static never_inline bool
parse_float(const uint8_t *const buf,
                          ParsedJson &pj, const uint32_t offset,
                          bool found_minus) {
  const char *p = reinterpret_cast<const char *>(buf + offset);
  bool negative = false;
  if (found_minus) {
    ++p;
    negative = true;
  }
  double i;
  if (*p == '0') { // 0 cannot be followed by an integer
    ++p;
    i = 0;
  } else {
    unsigned char digit = *p - '0';
    i = digit;
    p++;
    while (is_integer(*p)) {
      digit = *p - '0';
      i = 10 * i + digit;
      ++p;
    }
  }
  if ('.' == *p) {
    ++p;
    double fractionalweight = 1;
    if(is_integer(*p)) {
      unsigned char digit = *p - '0';
      ++p;
      fractionalweight *= 0.1;
      i = i + digit * fractionalweight;
    } else {
#ifdef JSON_TEST_NUMBERS // for unit testing
      foundInvalidNumber(buf + offset);
#endif
      return false;
    }
    while (is_integer(*p)) {
      unsigned char digit = *p - '0';
      ++p;
      fractionalweight *= 0.1;
      i = i + digit * fractionalweight;
    }
  }
  if (('e' == *p) || ('E' == *p)) {
    ++p;
    bool negexp = false;
    if ('-' == *p) {
      negexp = true;
      ++p;
    } else if ('+' == *p) {
      ++p;
    }
    if (!is_integer(*p)) {
#ifdef JSON_TEST_NUMBERS // for unit testing
      foundInvalidNumber(buf + offset);
#endif
      return false;
    }
    unsigned char digit = *p - '0';
    int64_t expnumber = digit; // exponential part
    p++;
    if (is_integer(*p)) {
      digit = *p - '0';
      expnumber = 10 * expnumber + digit;
      ++p;
    }
    if (is_integer(*p)) {
      digit = *p - '0';
      expnumber = 10 * expnumber + digit;
      ++p;
    }
    if (is_integer(*p)) {
      digit = *p - '0';
      expnumber = 10 * expnumber + digit;
      ++p;
    }
    if (is_integer(*p)) {
// we refuse to parse this
#ifdef JSON_TEST_NUMBERS // for unit testing
      foundInvalidNumber(buf + offset);
#endif
      return false;
    }
    int exponent = (negexp ? -expnumber : expnumber);
    if ((exponent > 308) || (exponent < -308)) {
// we refuse to parse this
#ifdef JSON_TEST_NUMBERS // for unit testing
      foundInvalidNumber(buf + offset);
#endif
      return false;
    }
    i *= power_of_ten[308 + exponent];
  }
  if(is_not_structural_or_whitespace(*p)) {
    return false;
  }
  double d = negative ? -i : i;
  pj.write_tape_double(d);
#ifdef JSON_TEST_NUMBERS // for unit testing
  foundFloat(d, buf + offset);
#endif
  return is_structural_or_whitespace(*p);
}